

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_functor::binary_op_atan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar20 [16];
  ulong uVar27;
  float fVar28;
  float fVar29;
  __m128 special_result;
  __m128 negative_mask_full_x;
  __m128 normal_result;
  __m128 pi_additions;
  __m128 negative_mask_y;
  __m128 negative_mask_x;
  __m128 normal_mode;
  __m128 not_equal_zero_y;
  __m128 not_equal_zero_x;
  __m128 magic_half_pi;
  __m128 magic_pi;
  __m128 magic_negative_zero;
  __m128 magic_zero;
  __m128 output_approx;
  __m128 fourth_power_of_input_approx;
  __m128 square_of_input_approx;
  __m128 input_approx;
  __m128 is_small_input;
  __m128 absolute;
  __m128 negative_mask;
  __m128 magic_a8;
  __m128 magic_a7;
  __m128 magic_a6;
  __m128 magic_a5;
  __m128 magic_a4;
  __m128 magic_a3;
  __m128 magic_a2;
  __m128 magic_a1;
  __m128 magic_a0;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one;
  __m128 magic_one;
  __m128 magic_negative_zero_1;
  int local_d78;
  float *local_d68;
  float *local_d60;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  ulong local_728;
  ulong uStack_720;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  uint uStack_4c;
  binary_op_atan2 op;
  int elempack_local;
  int w_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  
  if (elempack == 4) {
    local_d78 = 0;
    uVar2 = *(ulong *)ptr;
    uVar3 = *(ulong *)(ptr + 2);
    auVar6 = *(undefined1 (*) [16])ptr;
    local_d68 = outptr;
    local_d60 = ptr1;
    for (; local_d78 < w; local_d78 = local_d78 + 1) {
      fVar1 = *local_d60;
      auVar5._8_8_ = CONCAT44(fVar1,fVar1);
      auVar5._0_8_ = CONCAT44(fVar1,fVar1);
      local_908 = (float)uVar2;
      fStack_904 = (float)(uVar2 >> 0x20);
      fStack_900 = (float)uVar3;
      fStack_8fc = (float)(uVar3 >> 0x20);
      iVar7 = -(uint)(local_908 != 0.0);
      iVar9 = -(uint)(fStack_904 != 0.0);
      iVar11 = -(uint)(fStack_900 != 0.0);
      iVar13 = -(uint)(fStack_8fc != 0.0);
      uVar17 = CONCAT44(-(uint)(fVar1 != 0.0),-(uint)(fVar1 != 0.0)) & CONCAT44(iVar9,iVar7);
      uVar25 = CONCAT44(-(uint)(fVar1 != 0.0),-(uint)(fVar1 != 0.0)) & CONCAT44(iVar13,iVar11);
      uVar18 = CONCAT44(-(uint)(fVar1 < 0.0),-(uint)(fVar1 < 0.0)) &
               (CONCAT44(-(uint)(fStack_904 < 0.0),-(uint)(local_908 < 0.0)) & 0x8000000080000000 |
               0x40490fdb40490fdb);
      uVar26 = CONCAT44(-(uint)(fVar1 < 0.0),-(uint)(fVar1 < 0.0)) &
               (CONCAT44(-(uint)(fStack_8fc < 0.0),-(uint)(fStack_900 < 0.0)) & 0x8000000080000000 |
               0x40490fdb40490fdb);
      auVar20 = divps(auVar6,auVar5);
      local_728 = auVar20._0_8_;
      uStack_720 = auVar20._8_8_;
      uVar19 = local_728 & 0x7fffffff7fffffff;
      uVar27 = uStack_720 & 0x7fffffff7fffffff;
      local_298 = (float)uVar19;
      fStack_294 = (float)(uVar19 >> 0x20);
      fStack_290 = (float)uVar27;
      fStack_28c = (float)(uVar27 >> 0x20);
      iVar8 = -(uint)(1.0 < local_298);
      iVar10 = -(uint)(1.0 < fStack_294);
      iVar12 = -(uint)(1.0 < fStack_290);
      iVar14 = -(uint)(1.0 < fStack_28c);
      auVar4._8_8_ = CONCAT44(iVar14,iVar12) & 0xbf800000bf800000 |
                     ~CONCAT44(iVar14,iVar12) & uVar27;
      auVar4._0_8_ = CONCAT44(iVar10,iVar8) & 0xbf800000bf800000 | ~CONCAT44(iVar10,iVar8) & uVar19;
      auVar20._8_8_ =
           CONCAT44(iVar14,iVar12) & uVar27 | ~CONCAT44(iVar14,iVar12) & 0x3f8000003f800000;
      auVar20._0_8_ = CONCAT44(iVar10,iVar8) & uVar19 | ~CONCAT44(iVar10,iVar8) & 0x3f8000003f800000
      ;
      auVar20 = divps(auVar4,auVar20);
      local_6a8 = auVar20._0_4_;
      fStack_6a4 = auVar20._4_4_;
      fStack_6a0 = auVar20._8_4_;
      fStack_69c = auVar20._12_4_;
      fVar15 = local_6a8 * local_6a8;
      fVar21 = fStack_6a4 * fStack_6a4;
      fVar23 = fStack_6a0 * fStack_6a0;
      fVar28 = fStack_69c * fStack_69c;
      fVar16 = fVar15 * fVar15;
      fVar22 = fVar21 * fVar21;
      fVar24 = fVar23 * fVar23;
      fVar29 = fVar28 * fVar28;
      uVar19 = CONCAT44(iVar10,iVar8) & 0x3fc90fdb3fc90fdb;
      uVar27 = CONCAT44(iVar14,iVar12) & 0x3fc90fdb3fc90fdb;
      local_718 = (float)uVar19;
      fStack_714 = (float)(uVar19 >> 0x20);
      fStack_710 = (float)uVar27;
      fStack_70c = (float)(uVar27 >> 0x20);
      uVar19 = CONCAT44((fVar21 * (fVar22 * (fVar22 * (fVar22 * -0.01606863 + -0.07504295) +
                                            -0.14203644) + -0.33333072) +
                        fVar22 * (fVar22 * (fVar22 * (fVar22 * 0.0028498897 + 0.04269152) +
                                           0.10640934) + 0.1999262) + 1.0) * fStack_6a4 + fStack_714
                        ,(fVar15 * (fVar16 * (fVar16 * (fVar16 * -0.01606863 + -0.07504295) +
                                             -0.14203644) + -0.33333072) +
                         fVar16 * (fVar16 * (fVar16 * (fVar16 * 0.0028498897 + 0.04269152) +
                                            0.10640934) + 0.1999262) + 1.0) * local_6a8 + local_718)
               | local_728 & 0x8000000080000000;
      uVar27 = CONCAT44((fVar28 * (fVar29 * (fVar29 * (fVar29 * -0.01606863 + -0.07504295) +
                                            -0.14203644) + -0.33333072) +
                        fVar29 * (fVar29 * (fVar29 * (fVar29 * 0.0028498897 + 0.04269152) +
                                           0.10640934) + 0.1999262) + 1.0) * fStack_69c + fStack_70c
                        ,(fVar23 * (fVar24 * (fVar24 * (fVar24 * -0.01606863 + -0.07504295) +
                                             -0.14203644) + -0.33333072) +
                         fVar24 * (fVar24 * (fVar24 * (fVar24 * 0.0028498897 + 0.04269152) +
                                            0.10640934) + 0.1999262) + 1.0) * fStack_6a0 +
                         fStack_710) | uStack_720 & 0x8000000080000000;
      local_bf8 = (float)uVar19;
      fStack_bf4 = (float)(uVar19 >> 0x20);
      fStack_bf0 = (float)uVar27;
      fStack_bec = (float)(uVar27 >> 0x20);
      local_c08 = (float)uVar18;
      fStack_c04 = (float)(uVar18 >> 0x20);
      fStack_c00 = (float)uVar26;
      fStack_bfc = (float)(uVar26 >> 0x20);
      uVar18 = CONCAT44(fVar1,fVar1) & 0x8000000080000000 | 0x40490fdb40490fdb;
      uVar19 = CONCAT44(fVar1,fVar1) & 0x8000000080000000 | 0x40490fdb40490fdb;
      local_9f8 = (float)uVar18;
      fStack_9f4 = (float)(uVar18 >> 0x20);
      fStack_9f0 = (float)uVar19;
      fStack_9ec = (float)(uVar19 >> 0x20);
      uVar18 = CONCAT44(iVar9,iVar7) & (uVar2 & 0x8000000080000000 | 0x3fc90fdb3fc90fdb) |
               ~CONCAT44(iVar9,iVar7) &
               CONCAT44(-(uint)(fStack_9f4 < 0.0),-(uint)(local_9f8 < 0.0)) & 0x40490fdb40490fdb;
      uVar19 = CONCAT44(iVar13,iVar11) & (uVar3 & 0x8000000080000000 | 0x3fc90fdb3fc90fdb) |
               ~CONCAT44(iVar13,iVar11) &
               CONCAT44(-(uint)(fStack_9ec < 0.0),-(uint)(fStack_9f0 < 0.0)) & 0x40490fdb40490fdb;
      _p[2] = (float)uVar17;
      _p[3] = (float)(uVar17 >> 0x20);
      i = (int)uVar25;
      uStack_4c = (uint)(uVar25 >> 0x20);
      _b[2] = (float)uVar18;
      _b[3] = (float)(uVar18 >> 0x20);
      _p[0] = (float)uVar19;
      _p[1] = (float)(uVar19 >> 0x20);
      *(ulong *)local_d68 =
           uVar17 & CONCAT44(fStack_bf4 + fStack_c04,local_bf8 + local_c08) |
           CONCAT44(((uint)_p[3] ^ 0xffffffff) & (uint)_b[3],
                    ((uint)_p[2] ^ 0xffffffff) & (uint)_b[2]);
      *(ulong *)(local_d68 + 2) =
           uVar25 & CONCAT44(fStack_bec + fStack_bfc,fStack_bf0 + fStack_c00) |
           CONCAT44((uStack_4c ^ 0xffffffff) & (uint)_p[1],(i ^ 0xffffffffU) & (uint)_p[0]);
      local_d60 = local_d60 + 1;
      local_d68 = local_d68 + 4;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}